

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O2

string * __thiscall
OpenMD::Revision::getRevision_abi_cxx11_(string *__return_storage_ptr__,Revision *this)

{
  string rev;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  rev._M_dataplus._M_p = (pointer)&rev.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&rev,"b695faef3ed5d340f31b6fe104e8b5c263b0a1f4","");
  std::__cxx11::string::append((ulong)&rev,'(' - (char)rev._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (rev._M_string_length == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&rev);
  return __return_storage_ptr__;
}

Assistant:

std::string Revision::getRevision() {
    std::string r;
    std::string rev(revision, strnlen(revision, 40));
    rev.append(40 - rev.length(), ' ');
    r.append("Revision: ");
    // If there's no GIT SHA1 revision, just call this the RELEASE revision.
    if (!rev.empty()) {
      r.append(rev);
    } else {
      r.append("RELEASE");
    }
    return r;
  }